

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O1

aom_ext_part_status_t
anon_unknown.dwarf_12e43e3::ext_part_create_model
          (void *priv,aom_ext_part_config_t *part_config,aom_ext_part_model_t *ext_part_model)

{
  pointer pcVar1;
  undefined8 uVar2;
  aom_ext_part_status_t aVar3;
  undefined8 *puVar4;
  AssertionResult *pAVar5;
  void **value;
  SEARCH_METHODS *pSVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult AStack_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  AssertionResult local_1d8;
  undefined8 local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1a8,"received_data->version","kVersion",(int *)priv,
             &(anonymous_namespace)::kVersion);
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if ((undefined8 *)local_1a8._8_8_ == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&AStack_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
               ,0x1d2,(char *)pSVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&AStack_208,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&AStack_208);
    if ((long *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                     local_1f8._M_dataplus._M_p._0_1_) + 8))();
    }
  }
  uVar2 = local_1a8._8_8_;
  if ((undefined8 *)local_1a8._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1a8._8_8_ != (undefined8 *)(local_1a8._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_1a8._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  puVar4 = (undefined8 *)operator_new(0x60,(nothrow_t *)&std::nothrow);
  if (puVar4 == (undefined8 *)0x0) {
    local_1c8 = 0;
    local_1b0 = "toy_model";
    local_1b8 = "nullptr";
    local_1c0 = "!=";
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(&AStack_208,(char (*) [12])"Expected: (");
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1b0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [3])0xd0fe2c);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1c0);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [3])0xc78e90);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1b8);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [12])"), actual: ");
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1a8 + 0x10),"NULL",4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1f8);
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,(char (*) [5])" vs ");
    testing::PrintToString<decltype(nullptr)>((string *)local_1a8,(testing *)&local_1c8,value);
    pAVar5 = testing::AssertionResult::operator<<
                       (pAVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1a8);
    testing::AssertionResult::AssertionResult(&local_1d8,pAVar5);
    if ((ostream *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != (ostream *)(local_1a8 + 0x10)) {
      operator_delete((ostream *)CONCAT71(local_1a8._1_7_,local_1a8[0]));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
        &local_1f8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_));
    }
    if ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )AStack_208.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined8 **)
              AStack_208.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)AStack_208.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(*(undefined8 **)
                         AStack_208.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
      }
      operator_delete((void *)AStack_208.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    }
    if (local_1d8.success_ == false) {
      testing::Message::Message((Message *)local_1a8);
      if (local_1d8.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = (SEARCH_METHODS *)
                 ((_Alloc_hider *)
                 local_1d8.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
                 ,0x1d5,(char *)pSVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f8,(Message *)local_1a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8);
      if ((long *)CONCAT71(local_1a8._1_7_,local_1a8[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_1a8._1_7_,local_1a8[0]) + 8))();
      }
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_1d8.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar1 = ((_Alloc_hider *)
               local_1d8.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl)->_M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_1d8.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10)) {
        operator_delete(pcVar1);
      }
      operator_delete((void *)local_1d8.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    }
    aVar3 = AOM_EXT_PART_ERROR;
  }
  else {
    *puVar4 = priv;
    *ext_part_model = puVar4;
    local_1f8._M_dataplus._M_p._0_1_ = 0xc;
    testing::internal::CmpHelperEQ<int,BLOCK_SIZE>
              ((internal *)local_1a8,"part_config->superblock_size","BLOCK_64X64",
               &part_config->superblock_size,(BLOCK_SIZE *)&local_1f8);
    if (local_1a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1f8);
      if ((undefined8 *)local_1a8._8_8_ == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = *(SEARCH_METHODS **)local_1a8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&AStack_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_external_partition_test.cc"
                 ,0x1da,(char *)pSVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&AStack_208,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&AStack_208);
      if ((long *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_) + 8))();
      }
    }
    if ((undefined8 *)local_1a8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_1a8._8_8_ != (undefined8 *)(local_1a8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_1a8._8_8_);
      }
      operator_delete((void *)local_1a8._8_8_);
    }
    aVar3 = AOM_EXT_PART_OK;
  }
  return aVar3;
}

Assistant:

aom_ext_part_status_t ext_part_create_model(
    void *priv, const aom_ext_part_config_t *part_config,
    aom_ext_part_model_t *ext_part_model) {
  TestData *received_data = reinterpret_cast<TestData *>(priv);
  EXPECT_EQ(received_data->version, kVersion);
  ToyModel *toy_model = new (std::nothrow) ToyModel;
  if (toy_model == nullptr) {
    EXPECT_NE(toy_model, nullptr);
    return AOM_EXT_PART_ERROR;
  }
  toy_model->data = received_data;
  *ext_part_model = toy_model;
  EXPECT_EQ(part_config->superblock_size, BLOCK_64X64);
  return AOM_EXT_PART_OK;
}